

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOdc.c
# Opt level: O0

Odc_Lit_t Odc_And(Odc_Man_t *p,Odc_Lit_t iFan0,Odc_Lit_t iFan1)

{
  uint uVar1;
  Odc_Lit_t OVar2;
  Odc_Lit_t OVar3;
  Odc_Lit_t *pOVar4;
  Odc_Obj_t *pObj_00;
  Odc_Obj_t *pOVar5;
  int Temp;
  uint uMask1;
  uint uMask0;
  Odc_Lit_t *pEntry;
  Odc_Obj_t *pObj;
  Odc_Lit_t iFan1_local;
  Odc_Lit_t iFan0_local;
  Odc_Man_t *p_local;
  
  p_local._6_2_ = iFan0;
  if (iFan0 != iFan1) {
    OVar2 = Odc_Not(iFan1);
    if (iFan0 == OVar2) {
      p_local._6_2_ = Odc_Const0();
    }
    else {
      OVar2 = Odc_Regular(iFan0);
      OVar3 = Odc_Const1();
      if (OVar2 == OVar3) {
        OVar2 = Odc_Const1();
        p_local._6_2_ = iFan1;
        if (iFan0 != OVar2) {
          p_local._6_2_ = Odc_Const0();
        }
      }
      else {
        OVar2 = Odc_Regular(iFan1);
        OVar3 = Odc_Const1();
        if (OVar2 == OVar3) {
          OVar2 = Odc_Const1();
          if (iFan1 != OVar2) {
            p_local._6_2_ = Odc_Const0();
          }
        }
        else {
          pObj._4_2_ = iFan1;
          pObj._6_2_ = iFan0;
          if (iFan1 < iFan0) {
            pObj._4_2_ = iFan0;
            pObj._6_2_ = iFan1;
          }
          pOVar4 = Odc_HashLookup(p,pObj._6_2_,pObj._4_2_);
          if (*pOVar4 == 0) {
            pObj_00 = Odc_ObjNew(p);
            pObj_00->iFan0 = pObj._6_2_;
            pObj_00->iFan1 = pObj._4_2_;
            pObj_00->iNext = 0;
            pObj_00->TravId = 0;
            OVar2 = Odc_Regular(pObj._6_2_);
            pOVar5 = Odc_Lit2Obj(p,OVar2);
            uVar1 = pOVar5->uMask;
            OVar2 = Odc_Regular(pObj._4_2_);
            pOVar5 = Odc_Lit2Obj(p,OVar2);
            pObj_00->uMask = uVar1 | pOVar5->uMask;
            OVar2 = Odc_Obj2Lit(p,pObj_00);
            *pOVar4 = OVar2;
            p_local._6_2_ = *pOVar4;
          }
          else {
            p_local._6_2_ = *pOVar4;
          }
        }
      }
    }
  }
  return p_local._6_2_;
}

Assistant:

static inline Odc_Lit_t Odc_And( Odc_Man_t * p, Odc_Lit_t iFan0, Odc_Lit_t iFan1 )
{
    Odc_Obj_t * pObj;
    Odc_Lit_t * pEntry;
    unsigned uMask0, uMask1;
    int Temp;
    // consider trivial cases
    if ( iFan0 == iFan1 )
        return iFan0;
    if ( iFan0 == Odc_Not(iFan1) )
        return Odc_Const0();
    if ( Odc_Regular(iFan0) == Odc_Const1() )
        return iFan0 == Odc_Const1() ? iFan1 : Odc_Const0();
    if ( Odc_Regular(iFan1) == Odc_Const1() )
        return iFan1 == Odc_Const1() ? iFan0 : Odc_Const0();
    // canonicize the fanin order
    if ( iFan0 > iFan1 )
        Temp = iFan0, iFan0 = iFan1, iFan1 = Temp;
    // check if a node with these fanins exists
    pEntry = Odc_HashLookup( p, iFan0, iFan1 );
    if ( *pEntry )
        return *pEntry;
    // create a new node
    pObj = Odc_ObjNew( p );
    pObj->iFan0 = iFan0;
    pObj->iFan1 = iFan1;
    pObj->iNext = 0;
    pObj->TravId = 0;
    // set the mask
    uMask0 = Odc_Lit2Obj(p, Odc_Regular(iFan0))->uMask;
    uMask1 = Odc_Lit2Obj(p, Odc_Regular(iFan1))->uMask;
    pObj->uMask = uMask0 | uMask1;
    // add to the table
    *pEntry = Odc_Obj2Lit( p, pObj );
    return *pEntry;
}